

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::AsyncInputStream::pumpTo(AsyncInputStream *this,AsyncOutputStream *output,uint64_t amount)

{
  undefined1 auVar1 [16];
  AsyncOutputStream *pAVar2;
  Disposer *pDVar3;
  AttachmentPromiseNodeBase *this_00;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar4;
  AsyncPump *ptrCopy;
  undefined1 auVar5 [16];
  Promise<unsigned_long> PVar6;
  Promise<unsigned_long> promise;
  char local_40;
  undefined7 uStack_3f;
  AsyncOutputStream *local_38;
  uint64_t local_30;
  
  auVar5 = (**(code **)(*(long *)amount + 0x10))(&stack0xffffffffffffffc0,amount,output);
  auVar1._8_8_ = local_30;
  auVar1._0_8_ = local_38;
  if (local_40 == '\x01') {
    local_30 = 0;
    auVar5 = auVar1;
  }
  pPVar4 = auVar5._8_8_;
  if (local_40 == '\0') {
    pDVar3 = (Disposer *)operator_new(0x1020);
    pDVar3->_vptr_Disposer = (_func_int **)output;
    pDVar3[1]._vptr_Disposer = (_func_int **)amount;
    pDVar3[2]._vptr_Disposer = (_func_int **)CONCAT71(in_register_00000009,in_CL);
    pDVar3[3]._vptr_Disposer = (_func_int **)0x0;
    anon_unknown_77::AsyncPump::pump((AsyncPump *)&stack0xffffffffffffffc0);
    this_00 = (AttachmentPromiseNodeBase *)operator_new(0x28);
    kj::_::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase
              (this_00,(Own<kj::_::PromiseNode> *)&stack0xffffffffffffffc0);
    pAVar2 = local_38;
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0064d9a8;
    this_00[1].super_PromiseNode._vptr_PromiseNode =
         (_func_int **)&kj::_::HeapDisposer<kj::(anonymous_namespace)::AsyncPump>::instance;
    this_00[1].dependency.disposer = pDVar3;
    this->_vptr_AsyncInputStream =
         (_func_int **)
         &kj::_::
          HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AsyncPump>>>
          ::instance;
    this[1]._vptr_AsyncInputStream = (_func_int **)this_00;
    pPVar4 = extraout_RDX;
    if (local_38 != (AsyncOutputStream *)0x0) {
      local_38 = (AsyncOutputStream *)0x0;
      (*(code *)**(undefined8 **)CONCAT71(uStack_3f,local_40))
                ((undefined8 *)CONCAT71(uStack_3f,local_40),
                 pAVar2->_vptr_AsyncOutputStream[-2] + (long)&pAVar2->_vptr_AsyncOutputStream);
      pPVar4 = extraout_RDX_00;
    }
  }
  else {
    *(undefined1 (*) [16])this = auVar5;
  }
  PVar6.super_PromiseBase.node.ptr = pPVar4;
  PVar6.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar6.super_PromiseBase.node;
}

Assistant:

Promise<uint64_t> AsyncInputStream::pumpTo(
    AsyncOutputStream& output, uint64_t amount) {
  // See if output wants to dispatch on us.
  KJ_IF_MAYBE(result, output.tryPumpFrom(*this, amount)) {
    return kj::mv(*result);
  }

  // OK, fall back to naive approach.
  auto pump = heap<AsyncPump>(*this, output, amount);
  auto promise = pump->pump();
  return promise.attach(kj::mv(pump));
}